

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPFakeTransmitter::Create
          (RTPFakeTransmitter *this,size_t maximumpacketsize,RTPTransmissionParams *transparams)

{
  list<unsigned_int,_std::allocator<unsigned_int>_> *plVar1;
  RTPMemoryManager *pRVar2;
  int iVar3;
  
  iVar3 = -0x84;
  if ((this->init == true) && (iVar3 = -0x78, this->created == false)) {
    if (transparams == (RTPTransmissionParams *)0x0) {
      pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        transparams = (RTPTransmissionParams *)operator_new(0x60);
      }
      else {
        transparams = (RTPTransmissionParams *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,0x60,0);
      }
      (((RTPFakeTransmissionParams *)transparams)->super_RTPTransmissionParams).protocol =
           UserDefinedProto;
      (((RTPFakeTransmissionParams *)transparams)->super_RTPTransmissionParams).
      _vptr_RTPTransmissionParams = (_func_int **)&PTR__RTPFakeTransmissionParams_00144b20;
      (((RTPFakeTransmissionParams *)transparams)->localIPs).
      super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
      super__List_node_base._M_prev =
           (_List_node_base *)&((RTPFakeTransmissionParams *)transparams)->localIPs;
      (((RTPFakeTransmissionParams *)transparams)->localIPs).
      super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
      super__List_node_base._M_next =
           (_List_node_base *)&((RTPFakeTransmissionParams *)transparams)->localIPs;
      (((RTPFakeTransmissionParams *)transparams)->localIPs).
      super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node._M_size = 0;
      *(undefined2 *)
       &(((RTPFakeTransmissionParams *)transparams)->super_RTPTransmissionParams).field_0xc = 5000;
      ((RTPFakeTransmissionParams *)transparams)->bindIP = 0;
      ((RTPFakeTransmissionParams *)transparams)->multicastTTL = '\x01';
      ((RTPFakeTransmissionParams *)transparams)->currentdata = (uint8_t *)0x0;
    }
    else if (transparams->protocol != UserDefinedProto) {
      return -0x7d;
    }
    this->params = (RTPFakeTransmissionParams *)transparams;
    plVar1 = &this->localIPs;
    if (plVar1 != &((RTPFakeTransmissionParams *)transparams)->localIPs) {
      std::__cxx11::list<unsigned_int,std::allocator<unsigned_int>>::
      _M_assign_dispatch<std::_List_const_iterator<unsigned_int>>
                ((list<unsigned_int,std::allocator<unsigned_int>> *)plVar1,
                 (((RTPFakeTransmissionParams *)transparams)->localIPs).
                 super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
                 super__List_node_base._M_next);
    }
    if ((plVar1->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl._M_node.
        super__List_node_base._M_next == (_List_node_base *)plVar1) {
      GetLocalIPList_DNS(this);
      AddLoopbackAddress(this);
    }
    this->supportsmulticasting = false;
    iVar3 = -0x86;
    if (maximumpacketsize < 0x10000) {
      this->maxpacksize = maximumpacketsize;
      this->portbase = *(uint16_t *)&(this->params->super_RTPTransmissionParams).field_0xc;
      this->multicastTTL = this->params->multicastTTL;
      *(undefined8 *)&this->receivemode = 0;
      *(undefined8 *)((long)&this->localhostname + 4) = 0;
      *(undefined4 *)((long)&this->localhostnamelength + 4) = 0;
      this->created = true;
      this->waitingfordata = false;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int RTPFakeTransmitter::Create(size_t maximumpacketsize,const RTPTransmissionParams *transparams)
{
//	struct sockaddr_in addr;
//	int status;

	if (!init)
		return ERR_RTP_FAKETRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_ALREADYCREATED;
	}
	
	// Obtain transmission parameters
	
	if (transparams == 0)
		params = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) RTPFakeTransmissionParams;
	else
	{
		if (transparams->GetTransmissionProtocol() != RTPTransmitter::UserDefinedProto)
			return ERR_RTP_FAKETRANS_ILLEGALPARAMETERS;
		params = (RTPFakeTransmissionParams *)transparams;
	}

	// Check if portbase is even
	//if (params->GetPortbase()%2 != 0)
	//{
	//	MAINMUTEX_UNLOCK
	//	return ERR_RTP_FAKETRANS_PORTBASENOTEVEN;
	//}

	// Try to obtain local IP addresses

	localIPs = params->GetLocalIPList();
	if (localIPs.empty()) // User did not provide list of local IP addresses, calculate them
	{
		int status;
		
		if ((status = CreateLocalIPList()) < 0)
		{
			MAINMUTEX_UNLOCK
			return status;
		}
#ifdef RTPDEBUG
		std::cout << "Found these local IP addresses:" << std::endl;
		
		std::list<uint32_t>::const_iterator it;

		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			RTPIPv4Address a(*it);

			std::cout << a.GetAddressString() << std::endl;
		}
#endif // RTPDEBUG
	}

//#ifdef RTP_SUPPORT_IPV4MULTICAST
//	if (SetMulticastTTL(params->GetMulticastTTL()))
//		supportsmulticasting = true;
//	else
//		supportsmulticasting = false;
//#else // no multicast support enabled
	supportsmulticasting = false;
//#endif // RTP_SUPPORT_IPV4MULTICAST

	if (maximumpacketsize > RTPFAKETRANS_MAXPACKSIZE)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_SPECIFIEDSIZETOOBIG;
	}
	
	maxpacksize = maximumpacketsize;
	portbase = params->GetPortbase();
	multicastTTL = params->GetMulticastTTL();
	receivemode = RTPTransmitter::AcceptAll;

	localhostname = 0;
	localhostnamelength = 0;

	waitingfordata = false;
	created = true;

	MAINMUTEX_UNLOCK
	return 0;
}